

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * tinyformat::format<int,double>(char *fmt,int *args,double *args_1)

{
  string *in_RDI;
  ostringstream oss;
  ostringstream local_198 [32];
  double *in_stack_fffffffffffffe88;
  int *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  ostream *in_stack_fffffffffffffea0;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  format<int,double>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                     in_stack_fffffffffffffe88);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return in_RDI;
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}